

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

void __thiscall soul::heart::Printer::PrinterStream::printStateVariables(PrinterStream *this)

{
  bool bVar1;
  reference type_00;
  Variable *pVVar2;
  CodePrinter *pCVar3;
  string *name;
  Expression *e;
  ArrayView<soul::pool_ref<soul::heart::Variable>_> variables;
  char *local_d8;
  char *local_c8;
  string local_a8;
  reference local_78;
  pool_ref<soul::heart::Variable> *v;
  iterator __end3;
  iterator __begin3;
  vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  *__range3;
  VariablesWithType *type;
  iterator __end2;
  iterator __begin2;
  vector<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
  *__range2;
  undefined1 local_28 [8];
  VariableListByType list;
  PrinterStream *this_local;
  
  list.types.
  super__Vector_base<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  variables = Module::StateVariables::get(&this->module->stateVariables);
  Utilities::VariableListByType::VariableListByType((VariableListByType *)local_28,variables);
  __end2 = std::
           vector<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
           ::begin((vector<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
                    *)local_28);
  type = (VariablesWithType *)
         std::
         vector<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
         ::end((vector<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
                *)local_28);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<soul::heart::Utilities::VariableListByType::VariablesWithType_*,_std::vector<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>_>
                                     *)&type), bVar1) {
    type_00 = __gnu_cxx::
              __normal_iterator<soul::heart::Utilities::VariableListByType::VariablesWithType_*,_std::vector<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>_>
              ::operator*(&__end2);
    __end3 = std::
             vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
             ::begin(&type_00->variables);
    v = (pool_ref<soul::heart::Variable> *)
        std::
        vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
        ::end(&type_00->variables);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<soul::pool_ref<soul::heart::Variable>_*,_std::vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>_>
                                       *)&v), bVar1) {
      local_78 = __gnu_cxx::
                 __normal_iterator<soul::pool_ref<soul::heart::Variable>_*,_std::vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>_>
                 ::operator*(&__end3);
      pCVar3 = this->out;
      pVVar2 = pool_ref<soul::heart::Variable>::operator->(local_78);
      bVar1 = Variable::isExternal(pVVar2);
      if (bVar1) {
        local_c8 = "let external ";
      }
      else {
        pVVar2 = pool_ref<soul::heart::Variable>::operator->(local_78);
        bVar1 = Variable::isConstant(pVVar2);
        if (bVar1) {
          local_d8 = "let ";
        }
        else {
          local_d8 = "var ";
        }
        local_c8 = local_d8;
      }
      pCVar3 = choc::text::CodePrinter::operator<<(pCVar3,local_c8);
      getTypeDescription_abi_cxx11_(&local_a8,this,&type_00->type);
      pCVar3 = choc::text::CodePrinter::operator<<(pCVar3,&local_a8);
      choc::text::CodePrinter::operator<<(pCVar3,' ');
      std::__cxx11::string::~string((string *)&local_a8);
      pVVar2 = pool_ref<soul::heart::Variable>::operator->(local_78);
      name = Identifier::operator_cast_to_string_(&pVVar2->name);
      printVarWithPrefix(this,name);
      pVVar2 = pool_ref<soul::heart::Variable>::operator->(local_78);
      bVar1 = pool_ptr<soul::heart::Expression>::operator!=(&pVVar2->initialValue,(void *)0x0);
      if (bVar1) {
        choc::text::CodePrinter::operator<<(this->out," = ");
        pVVar2 = pool_ref<soul::heart::Variable>::operator->(local_78);
        e = pool_ptr<soul::heart::Expression>::operator*(&pVVar2->initialValue);
        printExpression(this,e);
      }
      pVVar2 = pool_ref<soul::heart::Variable>::operator->(local_78);
      printDescription(this,&pVVar2->annotation);
      pCVar3 = choc::text::CodePrinter::operator<<(this->out,';');
      choc::text::CodePrinter::operator<<(pCVar3,(NewLine *)&newLine);
      __gnu_cxx::
      __normal_iterator<soul::pool_ref<soul::heart::Variable>_*,_std::vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>_>
      ::operator++(&__end3);
    }
    __gnu_cxx::
    __normal_iterator<soul::heart::Utilities::VariableListByType::VariablesWithType_*,_std::vector<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>_>
    ::operator++(&__end2);
  }
  Utilities::VariableListByType::~VariableListByType((VariableListByType *)local_28);
  return;
}

Assistant:

void printStateVariables()
        {
            heart::Utilities::VariableListByType list (module.stateVariables.get());

            for (auto& type : list.types)
            {
                for (auto& v : type.variables)
                {
                    out << (v->isExternal() ? "let external " : (v->isConstant() ? "let " : "var "))
                        << getTypeDescription (type.type) << ' ';

                    printVarWithPrefix (v->name);

                    if (v->initialValue != nullptr)
                    {
                        out << " = ";
                        printExpression (*v->initialValue);
                    }

                    printDescription (v->annotation);
                    out << ';' << newLine;
                }
            }
        }